

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdCelsiusRcInAlpha::is_valid_val(MthdCelsiusRcInAlpha *this)

{
  byte bVar1;
  int j;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  for (bVar1 = 0x3c;
      (((uVar2 != 4 &&
        (uVar3 = (ulong)(this->super_SingleMthdTest).super_MthdTest.val << (bVar1 & 0x3f),
        uVar3 < 0xe000000000000000)) &&
       (uVar3 = uVar3 & 0xe000000000000000, uVar3 != 0xa000000000000000)) &&
      (uVar3 != 0x6000000000000000)); bVar1 = bVar1 - 8) {
    uVar2 = uVar2 + 1;
  }
  return 3 < uVar2;
}

Assistant:

bool is_valid_val() override {
		for (int j = 0; j < 4; j++) {
			int reg = extr(val, 8 * j, 4);
			if (reg == 6 || reg == 7 || reg == 0xa || reg == 0xb || reg >= 0xe)
				return false;
		}
		return true;
	}